

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluVerify3(word *pF,int nVars,If_Grp_t *g,If_Grp_t *g2,If_Grp_t *r,word BStruth,
                  word BStruth2,word FStruth)

{
  char cVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  word *pwVar6;
  word (*pawVar7) [1024];
  word (*__src) [1024];
  long lVar8;
  int nWords;
  word pTTRes [1024];
  word pTTWire2 [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  word wStack_12048;
  word *pwStack_12040;
  word awStack_12038 [1024];
  word awStack_10038 [1024];
  word local_e038 [1024];
  word local_c038 [6145];
  
  wStack_12048 = BStruth;
  if (((g->nVars < '\x02') || (g2->nVars < '\x02')) || (r->nVars < '\x02')) {
    __assert_fail("g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x2a5,
                  "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
                 );
  }
  if ((('\x06' < g->nVars) || ('\x06' < g2->nVars)) || ('\x06' < r->nVars)) {
    __assert_fail("g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x2a6,
                  "void If_CluVerify3(word *, int, If_Grp_t *, If_Grp_t *, If_Grp_t *, word, word, word)"
                 );
  }
  if (TruthAll[0][0] == 0) {
    If_CluInitTruthTables();
  }
  cVar1 = g->nVars;
  cVar2 = (char)nVars;
  pwStack_12040 = pF;
  if (0 < (long)cVar1) {
    uVar4 = 1 << (cVar2 - 6U & 0x1f);
    if (nVars < 7) {
      uVar4 = 1;
    }
    pwVar6 = local_c038;
    lVar8 = 0;
    do {
      if (0 < (int)uVar4) {
        memcpy(pwVar6,TruthAll + g->pVars[lVar8],(ulong)uVar4 * 8);
      }
      lVar8 = lVar8 + 1;
      pwVar6 = pwVar6 + 0x400;
    } while (cVar1 != lVar8);
  }
  pawVar7 = (word (*) [1024])local_c038;
  If_CluComposeLut(nVars,g,&wStack_12048,pawVar7,local_e038);
  cVar1 = g2->nVars;
  if (0 < (long)cVar1) {
    uVar4 = 1 << (cVar2 - 6U & 0x1f);
    if (nVars < 7) {
      uVar4 = 1;
    }
    lVar8 = 0;
    do {
      if (0 < (int)uVar4) {
        memcpy(pawVar7,TruthAll + g2->pVars[lVar8],(ulong)uVar4 * 8);
      }
      lVar8 = lVar8 + 1;
      pawVar7 = pawVar7 + 1;
    } while (cVar1 != lVar8);
  }
  pawVar7 = (word (*) [1024])local_c038;
  If_CluComposeLut(nVars,g2,&BStruth2,pawVar7,awStack_10038);
  cVar1 = r->nVars;
  if (0 < (long)cVar1) {
    uVar4 = 1 << (cVar2 - 6U & 0x1f);
    if (nVars < 7) {
      uVar4 = 1;
    }
    lVar8 = 0;
    do {
      iVar3 = (int)r->pVars[lVar8];
      if (iVar3 == nVars) {
        if (0 < (int)uVar4) {
          __src = &local_e038;
          goto LAB_0041677a;
        }
      }
      else if (nVars + 1 == iVar3) {
        if (0 < (int)uVar4) {
          __src = &awStack_10038;
LAB_0041677a:
          memcpy(pawVar7,__src,(ulong)uVar4 * 8);
        }
      }
      else if (0 < (int)uVar4) {
        __src = TruthAll + iVar3;
        goto LAB_0041677a;
      }
      lVar8 = lVar8 + 1;
      pawVar7 = pawVar7 + 1;
    } while (cVar1 != lVar8);
  }
  If_CluComposeLut(nVars,r,&FStruth,(word (*) [1024])local_c038,awStack_12038);
  pwVar6 = pwStack_12040;
  uVar4 = 1 << (cVar2 - 6U & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      if (awStack_12038[uVar5] != pwStack_12040[uVar5]) {
        printf("%d\n",nVars);
        Kit_DsdPrintFromTruth((uint *)&wStack_12048,(int)g->nVars);
        printf("    ");
        If_CluPrintGroup(g);
        Kit_DsdPrintFromTruth((uint *)&BStruth2,(int)g2->nVars);
        printf("    ");
        If_CluPrintGroup(g2);
        Kit_DsdPrintFromTruth((uint *)&FStruth,(int)r->nVars);
        printf("    ");
        If_CluPrintGroup(r);
        Kit_DsdPrintFromTruth((uint *)local_e038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)awStack_10038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)awStack_12038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)pwVar6,nVars);
        putchar(10);
        puts("Verification FAILED!");
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void If_CluVerify3( word * pF, int nVars, If_Grp_t * g, If_Grp_t * g2, If_Grp_t * r, word BStruth, word BStruth2, word FStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTWire2[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars >= 2 && g2->nVars >= 2 && r->nVars >= 2 );
    assert( g->nVars <= 6 && g2->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < g2->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g2->pVars[i]], nVars );
    If_CluComposeLut( nVars, g2, &BStruth2, pTTFans, pTTWire2 );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else if ( r->pVars[i] == nVars + 1 )
            If_CluCopy( pTTFans[i], pTTWire2, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, &FStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "%d\n", nVars );
//        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)&BStruth, g->nVars );   printf( "    " ); If_CluPrintGroup(g);  // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&BStruth2, g2->nVars ); printf( "    " ); If_CluPrintGroup(g2); // printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&FStruth, r->nVars );   printf( "    " ); If_CluPrintGroup(r);  // printf( "\n" );

        Kit_DsdPrintFromTruth( (unsigned*)pTTWire, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTWire2, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}